

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluka_reader.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint *puVar1;
  char cVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  long lVar12;
  bool bVar13;
  int nbin_E;
  int nbin_A;
  double Theta_min;
  double Delta_theta;
  double Delta_E;
  double E_min;
  double weight;
  double Theta_max;
  double E_max;
  istringstream input_file;
  ofstream output_file;
  ifstream input1;
  char buffer [1025];
  int local_a4c;
  double local_a48;
  int local_a3c;
  double local_a38;
  double local_a30;
  void *local_a28;
  double local_a20;
  double local_a18;
  double local_a10;
  ulong local_a08;
  ulong local_a00;
  undefined1 *local_9f8 [2];
  undefined1 local_9e8 [16];
  double local_9d8;
  double local_9c0 [2];
  string local_9b0 [104];
  ios_base local_948 [264];
  long local_840;
  filebuf local_838 [16];
  uint auStack_828 [2];
  byte abStack_820 [216];
  ios_base local_748 [264];
  long local_640 [4];
  byte abStack_620 [488];
  string local_438;
  undefined7 uStack_437;
  undefined1 local_428 [1016];
  
  local_a38 = (double)CONCAT44(local_a38._4_4_,argc);
  if (argc < 5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Si usa: ./a.out  -in FILE_IN   -out FILE_OUT");
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(0xff);
  }
  std::ifstream::ifstream(local_640);
  std::__cxx11::istringstream::istringstream((istringstream *)local_9c0);
  std::ofstream::ofstream(&local_840);
  iVar10 = 1;
  local_a48 = (double)CONCAT71(local_a48._1_7_,1);
  bVar13 = true;
  do {
    std::__cxx11::string::string(&local_438,argv[iVar10],(allocator *)local_9f8);
    iVar4 = std::__cxx11::string::compare((char *)&local_438);
    if ((undefined1 *)CONCAT71(uStack_437,local_438) != local_428) {
      operator_delete((undefined1 *)CONCAT71(uStack_437,local_438));
    }
    if (iVar4 == 0) {
      std::ifstream::open((char *)local_640,(_Ios_Openmode)argv[(long)iVar10 + 1]);
      local_a48 = (double)CONCAT71(local_a48._1_7_,
                                   (abStack_620[*(long *)(local_640[0] + -0x18)] & 5) != 0);
    }
    else {
      std::__cxx11::string::string(&local_438,argv[iVar10],(allocator *)local_9f8);
      iVar4 = std::__cxx11::string::compare((char *)&local_438);
      if ((undefined1 *)CONCAT71(uStack_437,local_438) != local_428) {
        operator_delete((undefined1 *)CONCAT71(uStack_437,local_438));
      }
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid argument: ",0x12);
        poVar7 = std::operator<<((ostream *)&std::cerr,argv[iVar10]);
        std::endl<char,std::char_traits<char>>(poVar7);
        exit(0xfe);
      }
      std::ofstream::open((char *)&local_840,(_Ios_Openmode)argv[(long)iVar10 + 1]);
      bVar13 = (abStack_820[*(long *)(local_840 + -0x18)] & 5) != 0;
    }
    iVar10 = iVar10 + 2;
    if (local_a38._0_4_ <= iVar10) {
      if ((((ulong)local_a48 & 1) == 0) && (!bVar13)) {
        leggi_bene((ifstream *)local_640,"total weight",(char *)&local_438,
                   (istringstream *)local_9c0);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::_M_extract<double>(local_9c0);
        leggi_bene((ifstream *)local_640,"linear energy binning",(char *)&local_438,
                   (istringstream *)local_9c0);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::_M_extract<double>(local_9c0);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::_M_extract<double>(local_9c0);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::operator>>((istream *)local_9c0,&local_a4c);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::_M_extract<double>(local_9c0);
        leggi_bene((ifstream *)local_640,"linear angular binning",(char *)&local_438,
                   (istringstream *)local_9c0);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::_M_extract<double>(local_9c0);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::_M_extract<double>(local_9c0);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::operator>>((istream *)local_9c0,&local_a3c);
        std::istream::ignore((long)local_9c0,0x400);
        std::istream::_M_extract<double>(local_9c0);
        leggi_bene((ifstream *)local_640,"follow in a matrix",(char *)&local_438,
                   (istringstream *)local_9c0);
        iVar10 = (int)((long)local_a3c * (long)local_a4c);
        uVar8 = 0xffffffffffffffff;
        if (-1 < iVar10) {
          uVar8 = (long)local_a3c * (long)local_a4c * 8;
        }
        local_a28 = operator_new__(uVar8);
        local_a08 = (ulong)(uint)((iVar10 / 10) * 2);
        local_a00 = (ulong)(uint)(iVar10 % 10);
        do {
          cVar2 = (char)(ifstream *)local_640;
          std::ios::widen((char)*(undefined8 *)(local_640[0] + -0x18) + cVar2);
          std::istream::getline((char *)local_640,(long)&local_438,'\x01');
        } while (local_438 == (string)0x0);
        if (9 < iVar10) {
          dVar11 = 0.0;
          local_a48 = (double)(ulong)(uint)(iVar10 / 10);
          do {
            std::ios::clear((int)*(undefined8 *)((long)local_9c0[0] + -0x18) +
                            (int)(istringstream *)local_9c0);
            local_a38 = dVar11;
            local_9f8[0] = local_9e8;
            sVar6 = strlen((char *)&local_438);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_9f8,&local_438,&local_438 + sVar6);
            std::__cxx11::stringbuf::str(local_9b0);
            if (local_9f8[0] != local_9e8) {
              operator_delete(local_9f8[0]);
            }
            lVar9 = 0;
            do {
              std::istream::_M_extract<double>(local_9c0);
              lVar9 = lVar9 + 8;
            } while (lVar9 != 0x50);
            std::ios::widen((char)*(undefined8 *)(local_640[0] + -0x18) + cVar2);
            dVar11 = local_a38;
            std::istream::getline((char *)local_640,(long)&local_438,'\x01');
            dVar11 = (double)((long)dVar11 + 1);
          } while (dVar11 != local_a48);
        }
        if (0 < (int)local_a00) {
          uVar8 = local_a00 & 0xffffffff;
          do {
            std::istream::_M_extract<double>(local_9c0);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        pvVar3 = local_a28;
        if (0 < local_a3c) {
          local_a48 = 0.0;
          do {
            if (0 < local_a4c) {
              lVar9 = (long)local_a48._0_4_;
              lVar12 = 0;
              dVar11 = local_a10;
              do {
                *(undefined8 *)(local_838 + *(long *)(local_840 + -0x18)) = 7;
                puVar1 = (uint *)((long)auStack_828 + *(long *)(local_840 + -0x18));
                *puVar1 = *puVar1 | 0x100;
                local_a38 = dVar11;
                poVar7 = std::ostream::_M_insert<double>(dVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
                poVar7 = std::ostream::_M_insert<double>(local_a18 + local_a38);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
                poVar7 = std::ostream::_M_insert<double>(local_a30);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
                poVar7 = std::ostream::_M_insert<double>(local_a30 + local_a20);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
                poVar7 = std::ostream::_M_insert<double>
                                   (*(double *)((long)pvVar3 + (local_a4c * lVar9 + lVar12) * 8) *
                                    local_a18 * local_a20 * local_9d8);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                dVar11 = local_a38 + local_a18;
                lVar12 = lVar12 + 1;
              } while ((int)lVar12 < local_a4c);
            }
            local_a30 = local_a20 + local_a30;
            uVar5 = SUB84(local_a48,0) + 1;
            local_a48 = (double)(ulong)uVar5;
          } while ((int)uVar5 < local_a3c);
        }
        std::ifstream::close();
        std::ofstream::close();
        local_840 = _VTT;
        *(undefined8 *)(local_838 + *(long *)(_VTT + -0x18) + -8) = ___cxa_atexit;
        std::filebuf::~filebuf(local_838);
        std::ios_base::~ios_base(local_748);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_9c0);
        std::ios_base::~ios_base(local_948);
        std::ifstream::~ifstream(local_640);
        return 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to open input files",0x1a);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(0xfd);
    }
  } while( true );
}

Assistant:

int main (int argc, char *argv[])
{
	if(argc < 5)
	{
		cerr << "Si usa: ./a.out  -in FILE_IN   -out FILE_OUT" << endl;
		exit(255);
	}

	ifstream input1;
	istringstream input_file;
	ofstream output_file;

	bool fallita_lettura_file_in = true, fallita_apertura_file_out = true;

	for (int i = 1; i < argc; i++)	// * We will iterate over argv[] to get the parameters stored inside.
	{								// * Note that we're starting on 1 because we don't need to know the
									// * path of the program, which is stored in argv[0]
		if (std::string(argv[i]) == "-in")
		{
			input1.open(argv[i+1]);
			fallita_lettura_file_in = input1.fail();
			i++;							// so that we skip in the for cycle the parsing of the <nome-file-particelle>
		}
		else if (std::string(argv[i]) == "-out") 
		{
			output_file.open(argv[i+1]);
			fallita_apertura_file_out = output_file.fail();
			i++;							// so that we skip in the for cycle the parsing of the <nome-file-lattice>
		}
		else
		{
			cerr << "Invalid argument: " << argv[i] << std::endl;
			exit(254);
		}
	}


	if ((fallita_lettura_file_in || fallita_apertura_file_out)) 
	{
		cerr << "Unable to open input files" << endl;
		exit(253);
	}



	char buffer[1025];
	double weight;

	leggi_bene(input1, "total weight", buffer, input_file);

	input_file.ignore(1024, ',');
	input_file.ignore(1024, 'w');
	input_file.ignore(1024, 'f');
	input_file >> weight; // letto il numero di particelle (come double!)

//	output_file << weight << endl;



	leggi_bene(input1, "linear energy binning", buffer, input_file);
	double E_min, E_max, Delta_E;
	int nbin_E;

	input_file.ignore(1024, 'm');
	input_file >> E_min;			// letta energia minima 

	input_file.ignore(1024, 'o');
	input_file >> E_max;			// letta energia massima

	input_file.ignore(1024, ',');
	input_file >> nbin_E;			// letto numero bin energia

	input_file.ignore(1024,'(');
	input_file >> Delta_E;			// letta ampiezza bins

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	output_file << E_min << "\t" << E_max << "\t" << nbin_E << "\t" << Delta_E << endl;
	**************************************/



	leggi_bene(input1, "linear angular binning", buffer, input_file);
	double Theta_min, Theta_max, Delta_theta;
	int nbin_A;

	input_file.ignore(1024, 'm');
	input_file >> Theta_min;		// letto angolo minimo 

	input_file.ignore(1024, 'o');
	input_file >> Theta_max;		// letto angolo massimo

	input_file.ignore(1024, ',');
	input_file >> nbin_A;			// letto numero bin angolo

	input_file.ignore(1024, '(');
	input_file >> Delta_theta;		// letta ampiezza bins angolari

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	output_file << Theta_min << "\t" << Theta_max << "\t" << nbin_A << "\t" << Delta_theta << endl;
	**************************************/
  

	leggi_bene(input1, "follow in a matrix", buffer, input_file);

	int totale_dati = nbin_E * nbin_A;
	int numero_righe = totale_dati / 10;
	int residuo_ultima_riga = totale_dati % 10;
	double *dati = new double[totale_dati];

	// saltiamo tutte le righe vuote
	do
		input1.getline(buffer, 1025);
	while(!strlen(buffer));


	for (int i = 0; i < numero_righe; i++)
	{
		input_file.clear();
		input_file.str(buffer);

		for(int k = 0; k < 10; k++)
		{
			input_file >> dati[i*10 + k];
		}

		input1.getline(buffer, 1025);
	}

	if (residuo_ultima_riga)
	{
		for (int j = 0; j < residuo_ultima_riga; j++)
		{
			input_file >> dati[numero_righe*10 + j];
		}
	}

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	for(int k=0; k < totale_dati; k++)
	{
		cout << setprecision(4) << setiosflags(ios::scientific) << dati[k] << ' ';
		if (!((k+1) % 10)) cout << endl;
	}
	**************************************/

	double 	a_temp = E_min;

	for (int i = 0; i < nbin_A; i++)
	{
		for (int j = 0; j < nbin_E; j++)
		{
			output_file << setprecision(7) << setiosflags(ios::scientific) << a_temp << "\t" 
						<< a_temp+Delta_E << "\t" << Theta_min << "\t" << Theta_min+Delta_theta << "\t" << dati[i*nbin_E + j]*Delta_E*Delta_theta*weight << endl;
			a_temp += Delta_E;
		}
		a_temp = E_min;
		Theta_min += Delta_theta;
	}


	input1.close();
	output_file.close();
	return 0;

}